

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id3.c
# Opt level: O2

int id3_fill_header(uchar *buf,uint len,unsigned_long id3_size)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  char *__assertion;
  
  if (buf == (uchar *)0x0) {
    __assertion = "buf != NULL";
    uVar2 = 0x5c;
  }
  else {
    if (len != 0) {
      iVar1 = 0;
      if (9 < len) {
        buf[0] = 'I';
        buf[1] = 'D';
        buf[2] = '3';
        buf[3] = '\x02';
        buf[4] = '\0';
        buf[5] = '\0';
        uVar3 = id3_sync_safe(id3_size);
        uVar2 = (uint)uVar3;
        *(uint *)(buf + 6) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        iVar1 = 10;
      }
      return iVar1;
    }
    __assertion = "len > 0";
    uVar2 = 0x5d;
  }
  __assert_fail(__assertion,"/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/id3.c",
                uVar2,"int id3_fill_header(unsigned char *, unsigned int, unsigned long)");
}

Assistant:

int id3_fill_header(unsigned char *buf, unsigned int len,
                    unsigned long id3_size) {
  assert(buf != NULL);
  assert(len > 0);
  if (len < 10)
    return 0;

  unsigned char *ptr = buf;
  memcpy(ptr, "ID3", 3); ptr += 3;
  UINT8_PACK(ptr, 0x02); UINT8_PACK(ptr, 0x00); /* version 2.0 */
  UINT8_PACK(ptr, 0x00);
  UINT32_PACK(ptr, id3_sync_safe(id3_size));
  return 10;
}